

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O1

void __thiscall
CEExceptionHandler::CEExceptionHandler
          (CEExceptionHandler *this,string *origin,string *message,string *type)

{
  CEExceptionHandler(this);
  std::__cxx11::string::operator=((string *)&this->origin_,(string *)origin);
  std::__cxx11::string::operator+=((string *)&this->message_,(string *)message);
  std::__cxx11::string::operator=((string *)&this->type_,(string *)type);
  return;
}

Assistant:

CEExceptionHandler::CEExceptionHandler(const std::string& origin,
                                       const std::string& message,
                                       const std::string& type) :
    CEExceptionHandler()
{
    origin_  = origin;
    message_ += message;
    type_    = type;
}